

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outputtype.cpp
# Opt level: O0

CTxDestination * GetDestinationForKey(CPubKey *key,OutputType type)

{
  bool bVar1;
  int in_EDX;
  CTxDestination *in_RDI;
  long in_FS_OFFSET;
  CScript witprog;
  CTxDestination witdest;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffed8;
  PKHash *in_stack_fffffffffffffee0;
  WitnessV0KeyHash *__t;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffee8;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *this;
  CTxDestination *this_00;
  WitnessV0KeyHash local_94;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_80;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == 0) {
    PKHash::PKHash((PKHash *)in_RDI,(CPubKey *)in_stack_fffffffffffffee8);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<PKHash,void,void,PKHash,void>(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  }
  else {
    if (1 < in_EDX - 1U) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/outputtype.cpp"
                    ,0x44,"CTxDestination GetDestinationForKey(const CPubKey &, OutputType)");
    }
    this_00 = in_RDI;
    bVar1 = CPubKey::IsCompressed((CPubKey *)in_stack_fffffffffffffed8);
    if (bVar1) {
      __t = &local_94;
      WitnessV0KeyHash::WitnessV0KeyHash
                ((WitnessV0KeyHash *)this_00,(CPubKey *)in_stack_fffffffffffffee8);
      this = &local_80;
      std::
      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
      ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>(this,__t);
      GetScriptForDestination(in_stack_fffffffffffffed8);
      if (in_EDX == 1) {
        ScriptHash::ScriptHash((ScriptHash *)this_00,(CScript *)this);
        std::
        variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
        ::variant<ScriptHash,void,void,ScriptHash,void>(this,(ScriptHash *)__t);
      }
      else {
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::variant(in_stack_fffffffffffffed8,
                  (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   *)0x353e3b);
      }
      CScript::~CScript((CScript *)in_stack_fffffffffffffed8);
      std::
      variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~variant(in_stack_fffffffffffffed8);
    }
    else {
      PKHash::PKHash((PKHash *)this_00,(CPubKey *)in_stack_fffffffffffffee8);
      std::
      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
      ::variant<PKHash,void,void,PKHash,void>(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CTxDestination GetDestinationForKey(const CPubKey& key, OutputType type)
{
    switch (type) {
    case OutputType::LEGACY: return PKHash(key);
    case OutputType::P2SH_SEGWIT:
    case OutputType::BECH32: {
        if (!key.IsCompressed()) return PKHash(key);
        CTxDestination witdest = WitnessV0KeyHash(key);
        CScript witprog = GetScriptForDestination(witdest);
        if (type == OutputType::P2SH_SEGWIT) {
            return ScriptHash(witprog);
        } else {
            return witdest;
        }
    }
    case OutputType::BECH32M:
    case OutputType::UNKNOWN: {} // This function should never be used with BECH32M or UNKNOWN, so let it assert
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}